

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionIsAnAcceptor::RunImpl
          (TestsessionFixtureSessionIsAnAcceptor *this)

{
  TestDetails *details;
  sessionFixtureSessionIsAnAcceptorHelper fixtureHelper;
  undefined1 local_660 [1576];
  TestDetails *local_38;
  
  details = &(this->super_Test).m_details;
  TestCallback::TestCallback((TestCallback *)local_660);
  local_660._1568_8_ = FIX::SocketServer::accept;
  local_660._1560_8_ = (Session *)0x0;
  local_660._0_8_ = &PTR__sessionFixture_0032aa80;
  local_660._8_8_ = &PTR__sessionFixtureSessionIsAnAcceptorHelper_0032aad8;
  local_38 = details;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionIsAnAcceptorHelper>
            ((sessionFixtureSessionIsAnAcceptorHelper *)local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)local_660);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionIsAnAcceptor) {
  createSession(0);
  CHECK(object->isAcceptor());
}